

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O2

void * __thiscall
crnlib::pixel_packer::pack<crnlib::color_quad<unsigned_char,int>>
          (pixel_packer *this,color_quad<unsigned_char,_int> *color,void *p,bool rescale)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  sbyte sVar5;
  int iVar6;
  uint i;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    uVar2 = this->m_comp_size[lVar7];
    if (uVar2 != 0) {
      uVar8 = this->m_comp_max[lVar7];
      uVar10 = (ulong)uVar8;
      bVar1 = (color->field_0).c[lVar7];
      if (rescale) {
        uVar4 = (bVar1 * uVar10 + 0x7f) / 0xff;
      }
      else {
        uVar4 = (ulong)(uint)bVar1;
        if (uVar8 <= bVar1) {
          uVar4 = (ulong)uVar8;
        }
      }
      uVar11 = this->m_comp_ofs[lVar7];
      for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + iVar6) {
        iVar6 = 8 - (uVar11 & 7);
        uVar9 = (uint)uVar10;
        sVar5 = (sbyte)(uVar11 & 7);
        uVar3 = (uint)uVar4;
        uVar10 = (ulong)(uVar9 >> ((byte)iVar6 & 0x1f));
        uVar4 = (ulong)(uVar3 >> ((byte)iVar6 & 0x1f));
        *(byte *)((long)p + (ulong)(uVar11 >> 3)) =
             (byte)(uVar3 << sVar5) |
             ~(byte)(uVar9 << sVar5) & *(byte *)((long)p + (ulong)(uVar11 >> 3));
        uVar11 = uVar11 + iVar6;
      }
    }
  }
  return (void *)((long)p + (ulong)this->m_pixel_stride);
}

Assistant:

void* pack(const color_quad_type& color, void* p, bool rescale = true) const
        {
            uint8* pDst = static_cast<uint8*>(p);

            for (uint i = 0; i < 4; i++)
            {
                const uint comp_size = m_comp_size[i];
                if (!comp_size)
                {
                    continue;
                }

                uint32 mx = m_comp_max[i];

                uint32 n;
                if (color_quad_type::component_traits::cFloat)
                {
                    typename color_quad_type::parameter_t t = color[i];
                    if (t < 0.0f)
                    {
                        n = 0;
                    }
                    else if (t > static_cast<typename color_quad_type::parameter_t>(mx))
                    {
                        n = mx;
                    }
                    else
                    {
                        n = math::minimum<uint32>(static_cast<uint32>(floor(t + .5f)), mx);
                    }
                }
                else if (rescale)
                {
                    if (color_quad_type::component_traits::cSigned)
                    {
                        n = math::maximum<int>(static_cast<int>(color[i]), 0);
                    }
                    else
                    {
                        n = static_cast<uint32>(color[i]);
                    }
                    const uint32 h = static_cast<uint32>(color_quad_type::component_traits::cMax);
                    n = static_cast<uint32>((static_cast<uint64>(n) * mx + (h >> 1)) / h);
                }
                else
                {
                    if (color_quad_type::component_traits::cSigned)
                    {
                        n = math::minimum<uint32>(static_cast<uint32>(math::maximum<int>(static_cast<int>(color[i]), 0)), mx);
                    }
                    else
                    {
                        n = math::minimum<uint32>(static_cast<uint32>(color[i]), mx);
                    }
                }

                uint src_bit_ofs = 0;
                uint dst_bit_ofs = m_comp_ofs[i];
                while (src_bit_ofs < comp_size)
                {
                    const uint cur_byte_bit_ofs = (dst_bit_ofs & 7);
                    const uint cur_byte_bits = 8 - cur_byte_bit_ofs;

                    uint byte_val = pDst[dst_bit_ofs >> 3];
                    uint bit_mask = (mx << cur_byte_bit_ofs) & 0xFF;
                    byte_val &= ~bit_mask;
                    byte_val |= (n << cur_byte_bit_ofs);
                    pDst[dst_bit_ofs >> 3] = static_cast<uint8>(byte_val);

                    mx >>= cur_byte_bits;
                    n >>= cur_byte_bits;

                    dst_bit_ofs += cur_byte_bits;
                    src_bit_ofs += cur_byte_bits;
                }
            }

            return pDst + m_pixel_stride;
        }